

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_bufferPool * ZSTDMT_createBufferPool(uint maxNbBuffers,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  int iVar1;
  pthread_mutex_t *__mutex;
  undefined4 in_EDI;
  void *unaff_retaddr;
  size_t in_stack_00000018;
  ZSTDMT_bufferPool *bufPool;
  undefined8 *puVar2;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  puVar2 = (undefined8 *)&stack0x00000008;
  customMem_00.customAlloc._4_4_ = in_EDI;
  customMem_00.customAlloc._0_4_ = in_stack_fffffffffffffff0;
  customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
  customMem_00.opaque = unaff_retaddr;
  __mutex = (pthread_mutex_t *)ZSTD_customCalloc(in_stack_00000018,customMem_00);
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
  }
  else {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      __mutex[1].__align = 0x10000;
      *(undefined4 *)((long)__mutex + 0x30) = in_EDI;
      *(undefined4 *)((long)__mutex + 0x34) = 0;
      *(undefined8 *)((long)__mutex + 0x38) = *puVar2;
      *(undefined8 *)((long)__mutex + 0x40) = puVar2[1];
      *(undefined8 *)((long)__mutex + 0x48) = puVar2[2];
    }
    else {
      customMem.customFree = (ZSTD_freeFunction)__mutex;
      customMem.customAlloc = (ZSTD_allocFunction)puVar2;
      customMem.opaque._0_4_ = in_stack_fffffffffffffff0;
      customMem.opaque._4_4_ = in_EDI;
      ZSTD_customFree((void *)puVar2[1],customMem);
      __mutex = (pthread_mutex_t *)0x0;
    }
  }
  return (ZSTDMT_bufferPool *)__mutex;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_createBufferPool(unsigned maxNbBuffers, ZSTD_customMem cMem)
{
    ZSTDMT_bufferPool* const bufPool = (ZSTDMT_bufferPool*)ZSTD_customCalloc(
        sizeof(ZSTDMT_bufferPool) + (maxNbBuffers-1) * sizeof(buffer_t), cMem);
    if (bufPool==NULL) return NULL;
    if (ZSTD_pthread_mutex_init(&bufPool->poolMutex, NULL)) {
        ZSTD_customFree(bufPool, cMem);
        return NULL;
    }
    bufPool->bufferSize = 64 KB;
    bufPool->totalBuffers = maxNbBuffers;
    bufPool->nbBuffers = 0;
    bufPool->cMem = cMem;
    return bufPool;
}